

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateCache::IsValidTemplateFilename
          (TemplateCache *this,string *filename,string *resolved_filename,FileStat *statbuf)

{
  bool bVar1;
  ostream *poVar2;
  FileStat *statbuf_local;
  string *resolved_filename_local;
  string *filename_local;
  TemplateCache *this_local;
  
  bVar1 = ResolveTemplateFilename(this,filename,resolved_filename,statbuf);
  if (bVar1) {
    bVar1 = FileStat::IsDirectory(statbuf);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
      poVar2 = std::operator<<(poVar2,(string *)resolved_filename);
      poVar2 = std::operator<<(poVar2,"is a directory and thus not readable");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
    poVar2 = std::operator<<(poVar2,"Unable to locate file ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TemplateCache::IsValidTemplateFilename(const string& filename,
                                            string* resolved_filename,
                                            FileStat* statbuf) const {
  if (!ResolveTemplateFilename(filename,
                               resolved_filename,
                               statbuf)) {
    LOG(WARNING) << "Unable to locate file " << filename << endl;
    return false;
  }
  if (statbuf->IsDirectory()) {
    LOG(WARNING) << *resolved_filename
                 << "is a directory and thus not readable" << endl;
    return false;
  }
  return true;
}